

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c9337::accumulator<std::basic_ostream<char,_std::char_traits<char>_>_>::push_back
          (accumulator<std::basic_ostream<char,_std::char_traits<char>_>_> *this,char c)

{
  ulong uVar1;
  char cVar2;
  
  if (this->width_ == 0) {
    std::__cxx11::string::_M_append
              ((char *)&this->lines_,(ulong)(this->indent_string_)._M_dataplus._M_p);
  }
  cVar2 = (char)&this->lines_;
  std::__cxx11::string::push_back(cVar2);
  uVar1 = this->width_ + 1;
  this->width_ = uVar1;
  if (0x4f < uVar1) {
    std::__cxx11::string::push_back(cVar2);
    this->width_ = 0;
    uVar1 = this->line_count_ + 1;
    this->line_count_ = uVar1;
    if (0x31 < uVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->os_,(this->lines_)._M_dataplus._M_p,(this->lines_)._M_string_length);
      this->line_count_ = 0;
      (this->lines_)._M_string_length = 0;
      *(this->lines_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::reserve((ulong)&this->lines_);
      return;
    }
  }
  return;
}

Assistant:

void accumulator<OStream>::push_back (char const c) {
        if (width_ == 0) {
            lines_ += indent_string_;
        }
        lines_ += c;
        if (++width_ >= line_width_) {
            lines_ += '\n';
            width_ = 0;
            if (++line_count_ >= lines_to_accumulate_) {
                os_ << lines_;
                line_count_ = 0;

                lines_.clear ();
                lines_.reserve (chars_to_reserve_);
            }
        }
    }